

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

Gia_Iso2Man_t * Gia_Iso2ManStart(Gia_Man_t *pGia)

{
  uint p;
  int nSize;
  Gia_Iso2Man_t *pGVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  
  pGVar1 = (Gia_Iso2Man_t *)calloc(1,0x90);
  pGVar1->pGia = pGia;
  p = pGia->nObjs;
  pGVar1->nObjs = p;
  p_00 = Vec_IntStartFull(p);
  pGVar1->vUniques = p_00;
  pVVar2 = Gia_Iso2ManCollectTies(pGia);
  pGVar1->vTied = pVVar2;
  nSize = Abc_PrimeCudd(p);
  pVVar2 = Vec_IntStart(nSize);
  pGVar1->vTable = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pGVar1->vPlaces = pVVar2;
  pVVar3 = Vec_PtrAlloc(1000);
  pGVar1->vSingles = pVVar3;
  pVVar2 = Vec_IntAlloc(10000);
  pGVar1->vVec0 = pVVar2;
  pVVar2 = Vec_IntAlloc(10000);
  pGVar1->vVec1 = pVVar2;
  pVVar2 = Vec_IntStart(p);
  pGVar1->vMap0 = pVVar2;
  pVVar2 = Vec_IntStart(p);
  pGVar1->vMap1 = pVVar2;
  pGVar1->nUniques = 1;
  Vec_IntWriteEntry(p_00,0,0);
  return pGVar1;
}

Assistant:

Gia_Iso2Man_t * Gia_Iso2ManStart( Gia_Man_t * pGia )
{
    Gia_Iso2Man_t * p;
    p = ABC_CALLOC( Gia_Iso2Man_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum( pGia );
    p->nUniques  = 0;
    // internal data
    p->vUniques  = Vec_IntStartFull( p->nObjs );
    p->vTied     = Gia_Iso2ManCollectTies( pGia );
    p->vTable    = Vec_IntStart( Abc_PrimeCudd(1*p->nObjs) );
    p->vPlaces   = Vec_IntAlloc( 1000 );
    p->vSingles  = Vec_PtrAlloc( 1000 );
    p->vVec0     = Vec_IntAlloc( 10000 );
    p->vVec1     = Vec_IntAlloc( 10000 );
    p->vMap0     = Vec_IntStart( p->nObjs );
    p->vMap1     = Vec_IntStart( p->nObjs );
    // add constant 0 object
    Vec_IntWriteEntry( p->vUniques, 0, p->nUniques++ );
    return p;
}